

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O3

int main(void)

{
  uint value;
  cake_iterator<false> first;
  cake_iterator<false> first_00;
  cake_iterator<false> last;
  cake_iterator<false> last_00;
  int iVar1;
  ostream *poVar2;
  uint uVar3;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar4;
  initializer_list<int> __l;
  initializer_list<double> l;
  multiset<int,_std::less<int>,_std::allocator<int>_> iset;
  vector<int,_std::allocator<int>_> v;
  skiplist<int,_std::less<int>_> iskip;
  skiplist<int,_std::less<int>_> skiplistFromVector;
  skiplist<double,_std::less<double>_> slFromInitializer;
  undefined8 in_stack_ffffffffffffe110;
  SLNode<double> *pSVar5;
  int iVar6;
  undefined1 uVar7;
  undefined7 in_stack_ffffffffffffe121;
  SLNode<int> *pSVar8;
  undefined8 in_stack_ffffffffffffe130;
  _Rb_tree_color _Var9;
  undefined4 in_stack_ffffffffffffe13c;
  vector<int,_std::allocator<int>_> local_1e70;
  double local_1e58 [3];
  skiplist<int,_std::less<int>_> local_1e40;
  skiplist<int,_std::less<int>_> local_1438;
  skiplist<double,_std::less<double>_> local_a30;
  
  _Var9 = _S_red;
  uVar3 = 0;
  do {
    local_1e40.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar3;
    if (4 < uVar3) {
      local_1e40.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = uVar3 - 5;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_equal<int>
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &stack0xffffffffffffe130,(int *)&local_1e40);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 10);
  local_1e40.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  pVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)&stack0xffffffffffffe130,(key_type *)&local_1e40);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &stack0xffffffffffffe130,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node
            );
  local_1e40.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  pVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)&stack0xffffffffffffe130,(key_type *)&local_1e40);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &stack0xffffffffffffe130,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node
            );
  local_1e40.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  pVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)&stack0xffffffffffffe130,(key_type *)&local_1e40);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &stack0xffffffffffffe130,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The mulitset has:\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  skiplist<int,_std::less<int>_>::skiplist(&local_1e40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Inserting into the skip list:\n",0x1e);
  uVar3 = 0;
  do {
    value = uVar3;
    if (4 < uVar3) {
      value = uVar3 - 5;
    }
    skiplist<int,_std::less<int>_>::insert(&local_1e40,value);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  skiplist<int,_std::less<int>_>::erase(&local_1e40,0);
  skiplist<int,_std::less<int>_>::erase(&local_1e40,0);
  skiplist<int,_std::less<int>_>::erase(&local_1e40,2);
  foundit(&local_1e40,2);
  foundit(&local_1e40,7);
  local_1438.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x40000000a;
  local_1438.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x600000003;
  local_1438.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_1438;
  std::vector<int,_std::allocator<int>_>::vector(&local_1e70,__l,(allocator_type *)&local_a30);
  skiplist<int,std::less<int>>::
  skiplist<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((skiplist<int,std::less<int>> *)&local_1438,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_1e70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_1e70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Skiplist constructed from vector:\n",0x22);
  if (local_1438.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1438.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar8 = (SLNode<int> *)0x0;
    iVar1 = 0;
  }
  else {
    pSVar8 = (*local_1438.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
               _M_impl.super__Vector_impl_data._M_start)->next;
    iVar1 = 0;
    if (pSVar8 != (SLNode<int> *)0x0) {
      iVar1 = pSVar8->count + -1;
    }
  }
  uVar7 = 0;
  first._8_4_ = iVar1;
  first.node_count_ = (int)in_stack_ffffffffffffe110;
  first.node_count_ref_ = (int)((ulong)in_stack_ffffffffffffe110 >> 0x20);
  first._12_4_ = iVar1;
  first.node._0_1_ = 0;
  first.node._1_7_ = in_stack_ffffffffffffe121;
  last.reverse_ = (bool)(char)in_stack_ffffffffffffe130;
  last._9_7_ = SUB87(in_stack_ffffffffffffe130,1);
  last._0_8_ = pSVar8;
  last.node._0_4_ = _Var9;
  last.node._4_4_ = in_stack_ffffffffffffe13c;
  iVar6 = iVar1;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>(first,last);
  local_1e58[0] = 1.1;
  local_1e58[1] = 0.5;
  local_1e58[2] = 100.3;
  l._M_len = 3;
  l._M_array = local_1e58;
  skiplist<double,_std::less<double>_>::skiplist(&local_a30,l);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Skiplist constructed using initialzer_list:\n",0x2c);
  if (local_a30.key.super__Vector_base<SLNode<double>_*,_std::allocator<SLNode<double>_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_a30.key.super__Vector_base<SLNode<double>_*,_std::allocator<SLNode<double>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar5 = (SLNode<double> *)0x0;
  }
  else {
    pSVar5 = (*local_a30.key.super__Vector_base<SLNode<double>_*,_std::allocator<SLNode<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_start)->next;
  }
  first_00._8_4_ = iVar1;
  first_00._0_8_ = pSVar5;
  first_00._12_4_ = iVar6;
  first_00.node._0_1_ = uVar7;
  first_00.node._1_7_ = in_stack_ffffffffffffe121;
  last_00.reverse_ = (bool)(char)in_stack_ffffffffffffe130;
  last_00._9_7_ = SUB87(in_stack_ffffffffffffe130,1);
  last_00._0_8_ = pSVar8;
  last_00.node._0_4_ = _Var9;
  last_00.node._4_4_ = in_stack_ffffffffffffe13c;
  display<skiplist<double,std::less<double>>::cake_iterator<false>>(first_00,last_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"No runtime exceptions. YAY!\n",0x1c);
  skiplist<double,_std::less<double>_>::~skiplist(&local_a30);
  skiplist<int,_std::less<int>_>::~skiplist(&local_1438);
  if (local_1e70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1e70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  skiplist<int,_std::less<int>_>::~skiplist(&local_1e40);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &stack0xffffffffffffe130);
  return 0;
}

Assistant:

int main() {
    // set operations
    std::multiset<int> iset;
    for(int i=0; i<10; i++)
        iset.insert(i%5);
    iset.erase(0);
    iset.erase(0);
    iset.erase(1);
    std::multiset<int>::iterator it = iset.find(2);
    it = iset.find(7);

    cout << "The mulitset has:\n";
    for(auto e: iset) {
        cout << e << " ";
    }
    cout << "\n";

    // skip list operations, must mirror the multiset operations
    skiplist<int> iskip;

    cout << "Inserting into the skip list:\n";
    for(int i=0; i<10; i++)
    {
        iskip.insert(i%5);
        cout << i%5 << " ";
    }
    cout << "\n";

    iskip.erase(0);
    iskip.erase(0);
    iskip.erase(2);

    foundit(iskip, 2);
    foundit(iskip, 7);

	std::vector<int> v = {10, 4, 3, 6, 1};
	skiplist<int> skiplistFromVector(begin(v), end(v));
	cout << "Skiplist constructed from vector:\n";
	display(begin(skiplistFromVector), end(skiplistFromVector));

	skiplist<double> slFromInitializer = {1.1, 0.5, 100.3};
	cout << "Skiplist constructed using initialzer_list:\n";
	display(begin(slFromInitializer), end(slFromInitializer));
    cout << "No runtime exceptions. YAY!\n";
}